

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O1

Reference<std::allocator<absl::LogSink_*>_> __thiscall
absl::inlined_vector_internal::Storage<absl::LogSink*,16ul,std::allocator<absl::LogSink*>>::
EmplaceBack<absl::LogSink*const&>
          (Storage<absl::LogSink*,16ul,std::allocator<absl::LogSink*>> *this,LogSink **args)

{
  LogSink **ppLVar1;
  ulong uVar2;
  ulong uVar3;
  Storage<absl::LogSink*,16ul,std::allocator<absl::LogSink*>> *pSVar4;
  size_type __n;
  LogSink **ppLStack_48;
  size_type sStack_40;
  LogSink **ppLStack_38;
  
  uVar2 = *(ulong *)this;
  uVar3 = 0x10;
  if ((uVar2 & 1) != 0) {
    uVar3 = *(ulong *)(this + 0x10);
  }
  if (uVar2 >> 1 == uVar3) {
    uVar2 = *(ulong *)this;
    pSVar4 = *(Storage<absl::LogSink*,16ul,std::allocator<absl::LogSink*>> **)(this + 8);
    uVar3 = uVar2 >> 1;
    ppLStack_48 = (LogSink **)0x0;
    sStack_40 = 0;
    __n = 0x20;
    if ((uVar2 & 1) != 0) {
      __n = *(long *)(this + 0x10) * 2;
    }
    ppLStack_38 = args;
    ppLVar1 = __gnu_cxx::new_allocator<absl::LogSink_*>::allocate
                        ((new_allocator<absl::LogSink_*> *)&ppLStack_48,__n,(void *)0x0);
    ppLVar1[uVar3] = *ppLStack_38;
    if (1 < uVar2) {
      if ((uVar2 & 1) == 0) {
        pSVar4 = this + 8;
      }
      uVar2 = 0;
      do {
        ppLVar1[uVar2] = *(LogSink **)(pSVar4 + uVar2 * 8);
        uVar2 = uVar2 + 1;
      } while (uVar3 != uVar2);
    }
    ppLStack_48 = ppLVar1;
    sStack_40 = __n;
    if (((byte)*this & 1) != 0) {
      operator_delete(*(void **)(this + 8),*(long *)(this + 0x10) << 3);
    }
    *(LogSink ***)(this + 8) = ppLStack_48;
    *(size_type *)(this + 0x10) = sStack_40;
    *(ulong *)this = (*(ulong *)this | 1) + 2;
    return ppLVar1 + uVar3;
  }
  if ((uVar2 & 1) == 0) {
    pSVar4 = this + 8;
  }
  else {
    pSVar4 = *(Storage<absl::LogSink*,16ul,std::allocator<absl::LogSink*>> **)(this + 8);
  }
  *(ValueType<std::allocator<absl::LogSink_*>_> *)(pSVar4 + (uVar2 >> 1) * 8) = *args;
  *(ulong *)this = uVar2 + 2;
  return (Reference<std::allocator<absl::LogSink_*>_>)(pSVar4 + (uVar2 >> 1) * 8);
}

Assistant:

bool GetIsAllocated() const { return GetSizeAndIsAllocated() & 1; }